

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTcEmbedBuilderDbl::finish_tree(CTcEmbedBuilderDbl *this,CTcPrsNode *cur)

{
  CTcPrsNode *in_RSI;
  char *in_stack_ffffffffffffffc8;
  CTPNDstr *in_stack_ffffffffffffffd0;
  
  if (in_RSI == (CTcPrsNode *)0x0) {
    in_RSI = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x2b7114);
    CTPNDstr::CTPNDstr(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(size_t)in_RSI);
  }
  return in_RSI;
}

Assistant:

virtual CTcPrsNode *finish_tree(CTcPrsNode *cur)
    {
        return (cur != 0 ? cur : new CTPNDstr("", 0));
    }